

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PanAndZoomWidget.cpp
# Opt level: O0

void __thiscall PanAndZoomWidget::ResetView(PanAndZoomWidget *this)

{
  PanAndZoomWidget *this_local;
  
  ResetRotation(this);
  ResetTranslation(this);
  ResetScale(this);
  return;
}

Assistant:

void PanAndZoomWidget::ResetView()
{
    ResetRotation();
    ResetTranslation();
    ResetScale();
}